

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.cpp
# Opt level: O0

void __thiscall Args_ErrorBogusBool_Test::~Args_ErrorBogusBool_Test(Args_ErrorBogusBool_Test *this)

{
  void *in_RDI;
  
  ~Args_ErrorBogusBool_Test((Args_ErrorBogusBool_Test *)0x592258);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Args, ErrorBogusBool) {
    bool errCalled = false;
    auto callback = [&errCalled](const std::string &s) { errCalled = true; };

    bool log = false;
    auto argv = makeArgs("--log=tru3");
    EXPECT_FALSE(ParseArg(&argv, "log", &log, callback));
    EXPECT_FALSE(log);
    EXPECT_TRUE(errCalled);
}